

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable.hxx
# Opt level: O2

pair<cmsys::_Hashtable_iterator<int,_int,_cmsys::hash<int>,_cmsys::_Identity<int>,_std::equal_to<int>,_std::allocator<char>_>,_bool>
* __thiscall
cmsys::
hashtable<int,_int,_cmsys::hash<int>,_cmsys::_Identity<int>,_std::equal_to<int>,_std::allocator<char>_>
::insert_unique_noresize
          (pair<cmsys::_Hashtable_iterator<int,_int,_cmsys::hash<int>,_cmsys::_Identity<int>,_std::equal_to<int>,_std::allocator<char>_>,_bool>
           *__return_storage_ptr__,
          hashtable<int,_int,_cmsys::hash<int>,_cmsys::_Identity<int>,_std::equal_to<int>,_std::allocator<char>_>
          *this,value_type_conflict *__obj)

{
  pointer pp_Var1;
  _Node *p_Var2;
  _Node *__cur;
  _Hashtable_node<int> *p_Var3;
  bool bVar4;
  ulong uVar5;
  
  pp_Var1 = (this->_M_buckets).
            super__Vector_base<cmsys::_Hashtable_node<int>_*,_std::allocator<cmsys::_Hashtable_node<int>_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  uVar5 = (ulong)(long)*__obj %
          (ulong)((long)(this->_M_buckets).
                        super__Vector_base<cmsys::_Hashtable_node<int>_*,_std::allocator<cmsys::_Hashtable_node<int>_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pp_Var1 >> 3);
  p_Var2 = pp_Var1[uVar5];
  p_Var3 = p_Var2;
  do {
    if (p_Var3 == (_Node *)0x0) {
      p_Var3 = _M_new_node(this,__obj);
      p_Var3->_M_next = p_Var2;
      (this->_M_buckets).
      super__Vector_base<cmsys::_Hashtable_node<int>_*,_std::allocator<cmsys::_Hashtable_node<int>_*>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar5] = p_Var3;
      this->_M_num_elements = this->_M_num_elements + 1;
      bVar4 = true;
LAB_0011d1f2:
      (__return_storage_ptr__->first)._M_cur = p_Var3;
      (__return_storage_ptr__->first)._M_ht = this;
      __return_storage_ptr__->second = bVar4;
      return __return_storage_ptr__;
    }
    if (p_Var3->_M_val == *__obj) {
      bVar4 = false;
      goto LAB_0011d1f2;
    }
    p_Var3 = p_Var3->_M_next;
  } while( true );
}

Assistant:

std::pair<typename hashtable<_Val, _Key, _HF, _Ex, _Eq, _All>::iterator, bool>
hashtable<_Val, _Key, _HF, _Ex, _Eq, _All>::insert_unique_noresize(
  const value_type& __obj)
{
  const size_type __n = _M_bkt_num(__obj);
  _Node* __first = _M_buckets[__n];

  for (_Node* __cur = __first; __cur; __cur = __cur->_M_next)
    if (_M_equals(_M_get_key(__cur->_M_val), _M_get_key(__obj)))
      return std::pair<iterator, bool>(iterator(__cur, this), false);

  _Node* __tmp = _M_new_node(__obj);
  __tmp->_M_next = __first;
  _M_buckets[__n] = __tmp;
  ++_M_num_elements;
  return std::pair<iterator, bool>(iterator(__tmp, this), true);
}